

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Message::_InternalParse::ReflectiveFieldParser::Field
          (ReflectiveFieldParser *this,int num,int wire_type)

{
  bool bVar1;
  WireType WVar2;
  Data *pDVar3;
  WireType in_EDX;
  Descriptor *in_RDI;
  DescriptorPool *pool;
  FieldDescriptor *field;
  Descriptor *in_stack_00000030;
  DescriptorPool *in_stack_00000038;
  int in_stack_ffffffffffffffcc;
  Descriptor *in_stack_ffffffffffffffd8;
  FieldDescriptor *local_8;
  
  local_8 = Descriptor::FindFieldByNumber(in_stack_ffffffffffffffd8,(int)((ulong)in_RDI >> 0x20));
  if ((local_8 == (FieldDescriptor *)0x0) &&
     (bVar1 = Descriptor::IsExtensionNumber(in_RDI,in_stack_ffffffffffffffcc), bVar1)) {
    pDVar3 = internal::ParseContext::data(*(ParseContext **)(in_RDI + 0x18));
    if (pDVar3->pool == (DescriptorPool *)0x0) {
      local_8 = Reflection::FindKnownExtensionByNumber
                          ((Reflection *)0x0,(int)((ulong)in_RDI >> 0x20));
    }
    else {
      local_8 = DescriptorPool::FindExtensionByNumber
                          (in_stack_00000038,in_stack_00000030,this._4_4_);
    }
  }
  if (local_8 == (FieldDescriptor *)0x0) {
    local_8 = (FieldDescriptor *)0x0;
  }
  else {
    FieldDescriptor::type(local_8);
    WVar2 = internal::WireFormat::WireTypeForFieldType(0);
    if ((WVar2 != in_EDX) &&
       ((bVar1 = FieldDescriptor::is_packable((FieldDescriptor *)in_RDI), !bVar1 ||
        (in_EDX != WIRETYPE_LENGTH_DELIMITED)))) {
      local_8 = (FieldDescriptor *)0x0;
    }
  }
  return local_8;
}

Assistant:

const FieldDescriptor* Field(int num, int wire_type) {
      auto field = descriptor_->FindFieldByNumber(num);

      // If that failed, check if the field is an extension.
      if (field == nullptr && descriptor_->IsExtensionNumber(num)) {
        const DescriptorPool* pool = ctx_->data().pool;
        if (pool == NULL) {
          field = reflection_->FindKnownExtensionByNumber(num);
        } else {
          field = pool->FindExtensionByNumber(descriptor_, num);
        }
      }
      if (field == nullptr) return nullptr;

      if (internal::WireFormat::WireTypeForFieldType(field->type()) !=
          wire_type) {
        if (field->is_packable()) {
          if (wire_type ==
              internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
            return field;
          }
        }
        return nullptr;
      }
      return field;
    }